

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O0

bool __thiscall minibag::Player::pauseCallback(Player *this,Request *req,Response *res)

{
  byte *in_RDX;
  byte *in_RSI;
  long in_RDI;
  char *in_stack_ffffffffffffff30;
  allocator<char> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator<char> local_b1;
  string local_b0 [16];
  allocator<char> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  undefined1 local_59 [33];
  string local_38 [32];
  byte *local_18;
  
  *(bool *)(in_RDI + 0x19b) = *in_RSI != (*(byte *)(in_RDI + 0x198) & 1);
  *(bool *)(in_RDI + 0x19c) = *in_RSI != 0;
  *in_RDX = *(byte *)(in_RDI + 0x19b) & 1;
  local_18 = in_RDX;
  if (*in_RDX == 0) {
    __rhs = &local_b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::operator+(in_stack_ffffffffffffff38,(char *)__rhs);
    std::__cxx11::string::operator=((string *)(local_18 + 8),(string *)&stack0xffffffffffffff70);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator(&local_b1);
  }
  else {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::operator+(__lhs,in_stack_ffffffffffffff30);
    std::__cxx11::string::operator=((string *)(local_18 + 8),local_38);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string((string *)(local_59 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_59);
  }
  return true;
}

Assistant:

bool Player::pauseCallback(std_srvs::SetBool::Request &req, std_srvs::SetBool::Response &res)
{
  pause_change_requested_ = (req.data != paused_);
  requested_pause_state_ = req.data;

  res.success = pause_change_requested_;

  if (res.success)
  {
    res.message = std::string("Playback is now ") + (requested_pause_state_ ? "paused" : "resumed");
  }
  else
  {
    res.message = std::string("Bag is already ") + (requested_pause_state_ ? "paused." : "running.");
  }

  return true;
}